

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinR2SCANL_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  ulong uVar1;
  double dVar2;
  double sigma_00;
  double dVar3;
  double lapl_00;
  double rho_00;
  double e;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    local_40 = scal_fact;
    do {
      lapl_00 = lapl[uVar1];
      rho_00 = rho[uVar1];
      dVar3 = sigma[uVar1];
      dVar2 = 0.0;
      if (1e-15 < rho_00) {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar3) {
          dVar2 = dVar3;
        }
        local_58 = dVar3;
        local_50 = rho_00;
        local_48 = lapl_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                  (rho_00,dVar2,lapl_00,0.0,&local_60);
        dVar2 = local_60;
        dVar3 = local_58;
        lapl_00 = local_48;
        rho_00 = local_50;
      }
      local_60 = dVar2 * rho_00;
      dVar2 = 0.0;
      if (1e-11 < rho_00) {
        dVar2 = 4.641588833612795e-30;
        if (4.641588833612795e-30 <= dVar3) {
          dVar2 = dVar3;
        }
        dVar3 = 1e-20;
        if (1e-20 <= local_60) {
          dVar3 = local_60;
        }
        sigma_00 = rho_00 * 8.0 * dVar3;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_unpolar_impl
                  (rho_00,sigma_00,lapl_00,dVar3,&local_38);
        dVar2 = local_38;
      }
      eps[uVar1] = dVar2 * local_40 + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}